

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O3

string * duckdb::GenerateDateFormat
                   (string *__return_storage_ptr__,string *separator,char *format_template)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  string format_specifier;
  allocator local_51;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  ::std::__cxx11::string::string((string *)&local_50,format_template,&local_51);
  if (local_48 == 0) {
    lVar3 = 0;
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(local_50[lVar2] == '-');
      lVar2 = lVar2 + 1;
    } while (local_48 != lVar2);
  }
  NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar1 = local_50;
  if (local_48 != 0) {
    lVar3 = 0;
    do {
      if (puVar1[lVar3] == '-') {
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(separator->_M_dataplus)._M_p);
      }
      else {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      lVar3 = lVar3 + 1;
    } while (local_48 != lVar3);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string GenerateDateFormat(const string &separator, const char *format_template) {
	string format_specifier = format_template;
	const auto amount_of_dashes = NumericCast<idx_t>(std::count(format_specifier.begin(), format_specifier.end(), '-'));
	// All our date formats must have at least one -
	D_ASSERT(amount_of_dashes);
	string result;
	result.reserve(format_specifier.size() - amount_of_dashes + (amount_of_dashes * separator.size()));
	for (const auto &character : format_specifier) {
		if (character == '-') {
			result += separator;
		} else {
			result += character;
		}
	}
	return result;
}